

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

bool __thiscall QProcessPrivate::openChannel(QProcessPrivate *this,Channel *channel)

{
  ProcessChannelType PVar1;
  QObject *parent;
  int iVar2;
  int *piVar3;
  QSocketNotifier *this_00;
  Connection *this_01;
  qsizetype objectSize;
  sockaddr *__addr;
  int in_R8D;
  Channel *pCVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QUtf8StringView fnName;
  QUtf8StringView fnName_00;
  Q_PIPE pipe [2];
  Connection CStack_78;
  Connection local_70;
  QString local_68;
  QString local_50;
  long local_38;
  
  this_01 = &CStack_78;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PVar1 = channel->type;
  if (PVar1 == Redirect) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::toLocal8Bit_helper
              ((QByteArray *)&local_68,(QChar *)(channel->file).d.ptr,(channel->file).d.size);
    if (&this->stdinChannel != channel) {
      bVar6 = channel->append;
      channel->pipe[0] = -1;
      pcVar5 = (char *)local_68.d.ptr;
      if (local_68.d.ptr == (char16_t *)0x0) {
        pcVar5 = "";
      }
LAB_004310ef:
      iVar2 = open64(pcVar5,(uint)bVar6 * 0x200 + 0x80241,0x1b6);
      if (iVar2 == -1) goto code_r0x0043110c;
      channel->pipe[1] = iVar2;
LAB_0043131d:
      bVar6 = true;
      goto LAB_00431320;
    }
    channel->pipe[1] = -1;
    pcVar5 = (char *)local_68.d.ptr;
    if (local_68.d.ptr == (char16_t *)0x0) {
      pcVar5 = "";
    }
    do {
      iVar2 = open64(pcVar5,0x80000,0x1ff);
      if (iVar2 != -1) {
        channel->pipe[0] = iVar2;
        goto LAB_0043131d;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    channel->pipe[0] = -1;
    QMetaObject::tr(&local_50,&QProcess::staticMetaObject,
                    "Could not open input redirection for reading",(char *)0x0,-1);
    setErrorAndEmit(this,FailedToStart,&local_50);
    goto LAB_0043126f;
  }
  if (PVar1 == PipeSource) {
    pCVar4 = &channel->process->stdinChannel;
  }
  else {
    if (PVar1 == Normal) {
      parent = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
      iVar2 = qt_create_pipe(channel->pipe);
      if (iVar2 == 0) {
        bVar6 = true;
        if ((((this->super_QIODevicePrivate).super_QObjectPrivate.threadData.
              super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p)->eventDispatcher).
            super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value._M_b._M_p !=
            (__pointer_type)0x0) {
          this_00 = (QSocketNotifier *)operator_new(0x10);
          if (&this->stdinChannel == channel) {
            QSocketNotifier::QSocketNotifier(this_00,Write,parent);
            channel->notifier = this_00;
            QSocketNotifier::setSocket(this_00,(long)channel->pipe[1]);
            __addr = (sockaddr *)channel->notifier;
            this_01 = &local_70;
          }
          else {
            QSocketNotifier::QSocketNotifier(this_00,Read,parent);
            channel->notifier = this_00;
            QSocketNotifier::setSocket(this_00,(long)channel->pipe[0]);
            __addr = (sockaddr *)channel->notifier;
          }
          QObject::connect((int)this_01,__addr,0x5aefb0);
          QMetaObject::Connection::~Connection(this_01);
        }
      }
      else {
        fnName.m_size = 0xffffffff;
        fnName.m_data = (storage_type *)0x4;
        anon_unknown.dwarf_14f7919::errorMessageForSyscall
                  (&local_68,(anon_unknown_dwarf_14f7919 *)0x59289f,fnName,in_R8D);
        setErrorAndEmit(this,FailedToStart,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar6 = false;
      }
      goto LAB_004313a4;
    }
    pCVar4 = channel;
    channel = &channel->process->stdoutChannel;
  }
  bVar6 = true;
  if ((channel->pipe[1] != -1) || (pCVar4->pipe[0] != -1)) goto LAB_004313a4;
  local_50.d.d = (Data *)0xffffffffffffffff;
  iVar2 = qt_create_pipe((int *)&local_50);
  bVar6 = iVar2 == 0;
  if (bVar6) {
    pCVar4->pipe[0] = (Q_PIPE)local_50.d.d;
    channel->pipe[1] = local_50.d.d._4_4_;
    goto LAB_004313a4;
  }
  fnName_00.m_size = 0xffffffff;
  fnName_00.m_data = (storage_type *)0x4;
  anon_unknown.dwarf_14f7919::errorMessageForSyscall
            (&local_68,(anon_unknown_dwarf_14f7919 *)0x59289f,fnName_00,in_R8D);
  setErrorAndEmit(this,FailedToStart,&local_68);
  if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_004313a4;
  LOCK();
  ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
       ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
  goto LAB_004313a4;
  objectSize = 2;
  goto LAB_00431339;
code_r0x0043110c:
  piVar3 = __errno_location();
  if (*piVar3 != 4) goto code_r0x00431116;
  goto LAB_004310ef;
code_r0x00431116:
  channel->pipe[1] = -1;
  QMetaObject::tr(&local_50,&QProcess::staticMetaObject,
                  "Could not open input redirection for reading",(char *)0x0,-1);
  setErrorAndEmit(this,FailedToStart,&local_50);
LAB_0043126f:
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar6 = false;
LAB_00431320:
  if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_004313a4;
  LOCK();
  ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
       ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
  goto LAB_004313a4;
  objectSize = 1;
LAB_00431339:
  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,objectSize,0x10);
LAB_004313a4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannel(Channel &channel)
{
    Q_Q(QProcess);

    if (channel.type == Channel::Normal) {
        // we're piping this channel to our own process
        if (qt_create_pipe(channel.pipe) != 0) {
            setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
            return false;
        }

        // create the socket notifiers
        if (threadData.loadRelaxed()->hasEventDispatcher()) {
            if (&channel == &stdinChannel) {
                channel.notifier = new QSocketNotifier(QSocketNotifier::Write, q);
                channel.notifier->setSocket(channel.pipe[1]);
                QObject::connect(channel.notifier, SIGNAL(activated(QSocketDescriptor)),
                                 q, SLOT(_q_canWrite()));
            } else {
                channel.notifier = new QSocketNotifier(QSocketNotifier::Read, q);
                channel.notifier->setSocket(channel.pipe[0]);
                const char *receiver;
                if (&channel == &stdoutChannel)
                    receiver = SLOT(_q_canReadStandardOutput());
                else
                    receiver = SLOT(_q_canReadStandardError());
                QObject::connect(channel.notifier, SIGNAL(activated(QSocketDescriptor)),
                                 q, receiver);
            }
        }

        return true;
    } else if (channel.type == Channel::Redirect) {
        // we're redirecting the channel to/from a file
        QByteArray fname = QFile::encodeName(channel.file);

        if (&channel == &stdinChannel) {
            // try to open in read-only mode
            channel.pipe[1] = -1;
            if ( (channel.pipe[0] = qt_safe_open(fname, O_RDONLY)) != -1)
                return true;    // success
            setErrorAndEmit(QProcess::FailedToStart,
                            QProcess::tr("Could not open input redirection for reading"));
        } else {
            int mode = O_WRONLY | O_CREAT;
            if (channel.append)
                mode |= O_APPEND;
            else
                mode |= O_TRUNC;

            channel.pipe[0] = -1;
            if ( (channel.pipe[1] = qt_safe_open(fname, mode, 0666)) != -1)
                return true; // success

            setErrorAndEmit(QProcess::FailedToStart,
                            QProcess::tr("Could not open input redirection for reading"));
        }
        return false;
    } else {
        Q_ASSERT_X(channel.process, "QProcess::start", "Internal error");

        Channel *source;
        Channel *sink;

        if (channel.type == Channel::PipeSource) {
            // we are the source
            source = &channel;
            sink = &channel.process->stdinChannel;

            Q_ASSERT(source == &stdoutChannel);
            Q_ASSERT(sink->process == this && sink->type == Channel::PipeSink);
        } else {
            // we are the sink;
            source = &channel.process->stdoutChannel;
            sink = &channel;

            Q_ASSERT(sink == &stdinChannel);
            Q_ASSERT(source->process == this && source->type == Channel::PipeSource);
        }

        if (source->pipe[1] != INVALID_Q_PIPE || sink->pipe[0] != INVALID_Q_PIPE) {
            // already created, do nothing
            return true;
        } else {
            Q_ASSERT(source->pipe[0] == INVALID_Q_PIPE && source->pipe[1] == INVALID_Q_PIPE);
            Q_ASSERT(sink->pipe[0] == INVALID_Q_PIPE && sink->pipe[1] == INVALID_Q_PIPE);

            Q_PIPE pipe[2] = { -1, -1 };
            if (qt_create_pipe(pipe) != 0) {
                setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
                return false;
            }
            sink->pipe[0] = pipe[0];
            source->pipe[1] = pipe[1];

            return true;
        }
    }
}